

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::denominate_surfaces(xr_object *this)

{
  char cVar1;
  xr_surface *this_00;
  const_iterator cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  reference pcVar6;
  iterator iVar7;
  iterator iVar8;
  reference ppxVar9;
  string *psVar10;
  __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
  *__lhs;
  string *psVar11;
  __type local_ba;
  uint local_9c;
  uint i;
  string *name_1;
  xr_surface_vec_it end_1;
  xr_surface_vec_it it_1;
  char suffix [8];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_58;
  int c;
  const_iterator end1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  const_iterator it1;
  string *name;
  size_type pos;
  string *texture;
  xr_surface *surface;
  xr_surface_vec_it end;
  xr_surface_vec_it it;
  xr_object *this_local;
  
  end._M_current =
       (xr_surface **)
       std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::begin
                 (&this->m_surfaces);
  surface = (xr_surface *)
            std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::end
                      (&this->m_surfaces);
  while (bVar3 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                                  *)&surface), bVar3) {
    ppxVar9 = __gnu_cxx::
              __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
              ::operator*(&end);
    this_00 = *ppxVar9;
    psVar10 = xr_surface::texture_abi_cxx11_(this_00);
    lVar5 = std::__cxx11::string::rfind((char)psVar10,0x5c);
    if (lVar5 == -1) {
      name = (string *)0x0;
    }
    else {
      name = (string *)(lVar5 + 1);
    }
    psVar10 = xr_surface::name_abi_cxx11_(this_00);
    it1._M_current = (char *)psVar10;
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)psVar10);
    end1._M_current = (char *)std::__cxx11::string::begin();
    local_48 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&end1,(difference_type)name);
    _Stack_58._M_current = (char *)std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=(&local_48,&stack0xffffffffffffffa8), bVar3) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      cVar2 = it1;
      cVar1 = *pcVar6;
      iVar4 = isalnum((int)cVar1);
      if (iVar4 != 0) {
        tolower((int)cVar1);
      }
      std::__cxx11::string::push_back((char)cVar2._M_current);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_48);
    }
    std::__cxx11::string::operator+=((string *)it1._M_current,"_S");
    __gnu_cxx::
    __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
    ::operator++(&end);
  }
  iVar7 = std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::begin
                    (&this->m_surfaces);
  iVar8 = std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::end
                    (&this->m_surfaces);
  std::
  sort<__gnu_cxx::__normal_iterator<xray_re::xr_surface**,std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>>,surface_name_pred>
            (iVar7._M_current,iVar8._M_current);
  end_1._M_current =
       (xr_surface **)
       std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::begin
                 (&this->m_surfaces);
  name_1 = (string *)
           std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::end
                     (&this->m_surfaces);
  while (bVar3 = __gnu_cxx::operator!=
                           (&end_1,(__normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                                    *)&name_1), bVar3) {
    ppxVar9 = __gnu_cxx::
              __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
              ::operator*(&end_1);
    psVar10 = xr_surface::name_abi_cxx11_(*ppxVar9);
    local_9c = 1;
    while( true ) {
      __lhs = __gnu_cxx::
              __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
              ::operator++(&end_1);
      bVar3 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                                *)&name_1);
      local_ba = false;
      if (bVar3) {
        ppxVar9 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                  ::operator*(&end_1);
        psVar11 = xr_surface::name_abi_cxx11_(*ppxVar9);
        local_ba = std::operator==(psVar11,psVar10);
      }
      if (local_ba == false) break;
      snprintf((char *)((long)&it_1._M_current + 7),8,"%u",(ulong)local_9c);
      ppxVar9 = __gnu_cxx::
                __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                ::operator*(&end_1);
      psVar11 = xr_surface::name_abi_cxx11_(*ppxVar9);
      std::__cxx11::string::operator+=((string *)psVar11,(char *)((long)&it_1._M_current + 7));
      local_9c = local_9c + 1;
    }
  }
  return;
}

Assistant:

void xr_object::denominate_surfaces()
{
	for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end(); it != end; ++it) {
		xr_surface* surface = *it;
		const std::string& texture = surface->texture();
		std::string::size_type pos = texture.rfind('\\');
		if (pos == std::string::npos)
			pos = 0;
		else
			++pos;
		std::string& name = surface->name();
		name.reserve(texture.size() - pos + 3);
		for (std::string::const_iterator it1 = texture.begin() + pos,
				end1 = texture.end(); it1 != end1; ++it1) {
			int c = *it1;
			name.push_back(std::isalnum(c) ? char(std::tolower(c)) : '_');
		}
		name += "_S";
	}
	std::sort(m_surfaces.begin(), m_surfaces.end(), surface_name_pred());
	char suffix[8];
	for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end(); it != end;) {
		const std::string& name = (*it)->name();
		for (unsigned i = 1; ++it != end && (*it)->name() == name; ++i) {
			xr_snprintf(suffix, sizeof(suffix), "%u", i);
			(*it)->name() += suffix;
		}
	}
}